

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniscript.h
# Opt level: O1

void miniscript::internal::BuildBack<XOnlyPubKey>
               (MiniscriptContext script_ctx,Fragment nt,
               vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
               *constructed,bool reverse)

{
  pointer psVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  Node<XOnlyPubKey> *pNVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  long in_FS_OFFSET;
  vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
  ret;
  vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
  local_78;
  NoDupCheck local_59;
  Node<XOnlyPubKey> *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_50;
  shared_ptr<const_miniscript::Node<XOnlyPubKey>_> local_48;
  Fragment local_34;
  MiniscriptContext local_30;
  undefined1 local_29;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  psVar1 = (constructed->
           super__Vector_base<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_48.super___shared_ptr<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = psVar1[-1].
           super___shared_ptr<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  local_48.super___shared_ptr<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       psVar1[-1].
       super___shared_ptr<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  psVar1[-1].super___shared_ptr<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  psVar1[-1].super___shared_ptr<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (constructed->
  super__Vector_base<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = psVar1 + -1;
  p_Var2 = psVar1[-1].
           super___shared_ptr<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  local_34 = nt;
  local_30 = script_ctx;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  if (reverse) {
    psVar1 = (constructed->
             super__Vector_base<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    local_78.
    super__Vector_base<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_78.
    super__Vector_base<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_78.
    super__Vector_base<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
    ::reserve(&local_78,2);
    std::
    vector<std::shared_ptr<miniscript::Node<XOnlyPubKey>const>,std::allocator<std::shared_ptr<miniscript::Node<XOnlyPubKey>const>>>
    ::emplace_back<std::shared_ptr<miniscript::Node<XOnlyPubKey>const>>
              ((vector<std::shared_ptr<miniscript::Node<XOnlyPubKey>const>,std::allocator<std::shared_ptr<miniscript::Node<XOnlyPubKey>const>>>
                *)&local_78,&local_48);
    std::
    vector<std::shared_ptr<miniscript::Node<XOnlyPubKey>const>,std::allocator<std::shared_ptr<miniscript::Node<XOnlyPubKey>const>>>
    ::emplace_back<std::shared_ptr<miniscript::Node<XOnlyPubKey>const>>
              ((vector<std::shared_ptr<miniscript::Node<XOnlyPubKey>const>,std::allocator<std::shared_ptr<miniscript::Node<XOnlyPubKey>const>>>
                *)&local_78,psVar1 + -1);
    local_58 = (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<miniscript::Node<XOnlyPubKey>const,std::allocator<miniscript::Node<XOnlyPubKey>>,miniscript::internal::NoDupCheck,miniscript::MiniscriptContext_const&,miniscript::Fragment&,std::vector<std::shared_ptr<miniscript::Node<XOnlyPubKey>const>,std::allocator<std::shared_ptr<miniscript::Node<XOnlyPubKey>const>>>>
              (&_Stack_50,&local_58,(allocator<miniscript::Node<XOnlyPubKey>_> *)&local_29,&local_59
               ,&local_30,&local_34,&local_78);
  }
  else {
    psVar1 = (constructed->
             super__Vector_base<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    local_78.
    super__Vector_base<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_78.
    super__Vector_base<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_78.
    super__Vector_base<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
    ::reserve(&local_78,2);
    std::
    vector<std::shared_ptr<miniscript::Node<XOnlyPubKey>const>,std::allocator<std::shared_ptr<miniscript::Node<XOnlyPubKey>const>>>
    ::emplace_back<std::shared_ptr<miniscript::Node<XOnlyPubKey>const>>
              ((vector<std::shared_ptr<miniscript::Node<XOnlyPubKey>const>,std::allocator<std::shared_ptr<miniscript::Node<XOnlyPubKey>const>>>
                *)&local_78,psVar1 + -1);
    std::
    vector<std::shared_ptr<miniscript::Node<XOnlyPubKey>const>,std::allocator<std::shared_ptr<miniscript::Node<XOnlyPubKey>const>>>
    ::emplace_back<std::shared_ptr<miniscript::Node<XOnlyPubKey>const>>
              ((vector<std::shared_ptr<miniscript::Node<XOnlyPubKey>const>,std::allocator<std::shared_ptr<miniscript::Node<XOnlyPubKey>const>>>
                *)&local_78,&local_48);
    local_58 = (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<miniscript::Node<XOnlyPubKey>const,std::allocator<miniscript::Node<XOnlyPubKey>>,miniscript::internal::NoDupCheck,miniscript::MiniscriptContext_const&,miniscript::Fragment&,std::vector<std::shared_ptr<miniscript::Node<XOnlyPubKey>const>,std::allocator<std::shared_ptr<miniscript::Node<XOnlyPubKey>const>>>>
              (&_Stack_50,&local_58,(allocator<miniscript::Node<XOnlyPubKey>_> *)&local_29,&local_59
               ,&local_30,&local_34,&local_78);
  }
  _Var4._M_pi = _Stack_50._M_pi;
  pNVar3 = local_58;
  psVar1 = (constructed->
           super__Vector_base<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_58 = (Node<XOnlyPubKey> *)0x0;
  _Stack_50._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var2 = psVar1[-1].
           super___shared_ptr<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  psVar1[-1].super___shared_ptr<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = pNVar3;
  psVar1[-1].super___shared_ptr<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var4._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  if (_Stack_50._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_50._M_pi);
  }
  std::
  vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
  ::~vector(&local_78);
  if (local_48.super___shared_ptr<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.
               super___shared_ptr<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void BuildBack(const MiniscriptContext script_ctx, Fragment nt, std::vector<NodeRef<Key>>& constructed, const bool reverse = false)
{
    NodeRef<Key> child = std::move(constructed.back());
    constructed.pop_back();
    if (reverse) {
        constructed.back() = MakeNodeRef<Key>(internal::NoDupCheck{}, script_ctx, nt, Vector(std::move(child), std::move(constructed.back())));
    } else {
        constructed.back() = MakeNodeRef<Key>(internal::NoDupCheck{}, script_ctx, nt, Vector(std::move(constructed.back()), std::move(child)));
    }
}